

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.cpp
# Opt level: O1

void __thiscall pm::Sampler::resize(Sampler *this,uint numSamples)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer puVar3;
  
  this->numSamples_ = numSamples;
  pVVar1 = (this->samples_).super__Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->samples_).super__Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar1) {
    (this->samples_).super__Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar1;
  }
  pVVar1 = (this->diskSamples_).super__Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->diskSamples_).super__Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar1) {
    (this->diskSamples_).super__Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar1;
  }
  pVVar2 = (this->hemisphereSamples_).super__Vector_base<pm::Vector3,_std::allocator<pm::Vector3>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->hemisphereSamples_).super__Vector_base<pm::Vector3,_std::allocator<pm::Vector3>_>.
      _M_impl.super__Vector_impl_data._M_finish != pVVar2) {
    (this->hemisphereSamples_).super__Vector_base<pm::Vector3,_std::allocator<pm::Vector3>_>._M_impl
    .super__Vector_impl_data._M_finish = pVVar2;
  }
  std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::reserve
            (&this->samples_,(ulong)(numSamples * this->numSets_));
  (*this->_vptr_Sampler[2])(this);
  puVar3 = (this->shuffledIndices_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->shuffledIndices_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar3) {
    (this->shuffledIndices_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish = puVar3;
  }
  setupShuffleIndices(this);
  mapSamplesToDisk(this);
  return;
}

Assistant:

void Sampler::resize(unsigned int numSamples)
{
	// Set the new number first as some methods will use it internally
	numSamples_ = numSamples;

	samples_.clear();
	diskSamples_.clear();
	hemisphereSamples_.clear();

	samples_.reserve(numSamples_ * numSets_);
	generateSamples();

	shuffledIndices_.clear();
	setupShuffleIndices();

	mapSamplesToDisk();
}